

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

void __thiscall S2Polygon::S2Polygon(S2Polygon *this)

{
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polygon_002bcb68;
  this->num_vertices_ = 0;
  this->unindexed_contains_calls_ = (__atomic_base<int>)0x0;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002bc088;
  (this->bound_).lat_.bounds_.c_[0] = 1.0;
  (this->bound_).lat_.bounds_.c_[1] = 0.0;
  (this->bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  (this->subregion_bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002bc088;
  (this->subregion_bound_).lat_.bounds_.c_[0] = 1.0;
  (this->subregion_bound_).lat_.bounds_.c_[1] = 0.0;
  (this->subregion_bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->subregion_bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  return;
}

Assistant:

S2Polygon::S2Polygon()
    : s2debug_override_(S2Debug::ALLOW),
      error_inconsistent_loop_orientations_(false),
      num_vertices_(0),
      unindexed_contains_calls_(0) {
}